

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3tokResetCursor(Fts3tokCursor *pCsr)

{
  if ((sqlite3_vtab *)pCsr->pCsr != (sqlite3_vtab *)0x0) {
    (*((pCsr->base).pVtab[1].pModule)->xDisconnect)((sqlite3_vtab *)pCsr->pCsr);
    pCsr->pCsr = (sqlite3_tokenizer_cursor *)0x0;
  }
  sqlite3_free(pCsr->zInput);
  pCsr->zInput = (char *)0x0;
  pCsr->iRowid = 0;
  pCsr->zToken = (char *)0x0;
  pCsr->nToken = 0;
  pCsr->iStart = 0;
  pCsr->iEnd = 0;
  pCsr->iPos = 0;
  return;
}

Assistant:

static void fts3tokResetCursor(Fts3tokCursor *pCsr){
  if( pCsr->pCsr ){
    Fts3tokTable *pTab = (Fts3tokTable *)(pCsr->base.pVtab);
    pTab->pMod->xClose(pCsr->pCsr);
    pCsr->pCsr = 0;
  }
  sqlite3_free(pCsr->zInput);
  pCsr->zInput = 0;
  pCsr->zToken = 0;
  pCsr->nToken = 0;
  pCsr->iStart = 0;
  pCsr->iEnd = 0;
  pCsr->iPos = 0;
  pCsr->iRowid = 0;
}